

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_RH_ENABLES_Unmarshal(TPMI_RH_ENABLES *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_RH_ENABLES TVar1;
  TPM_RC TVar2;
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_RH_ENABLES *target_local;
  
  TVar2 = UINT32_Unmarshal(target,buffer,size);
  if (TVar2 != 0) {
    return TVar2;
  }
  TVar1 = *target;
  if (TVar1 != 0x40000001) {
    if (TVar1 == 0x40000007) {
      if (flag == 0) {
        return 0x84;
      }
    }
    else if (2 < TVar1 + 0xbffffff5) {
      return 0x84;
    }
  }
  return 0;
}

Assistant:

TPM_RC
TPMI_RH_ENABLES_Unmarshal(TPMI_RH_ENABLES *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
        case TPM_RH_PLATFORM:
        case TPM_RH_ENDORSEMENT:
        case TPM_RH_PLATFORM_NV:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}